

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O2

VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
 __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::
getVariants<Kernel::Literal*>
          (SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs> *this,Literal *query,
          bool retrieveSubstitutions)

{
  Literal *pLVar1;
  Leaf *pLVar2;
  int in_ECX;
  undefined7 in_register_00000011;
  _Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution_*,_false>
  local_b0;
  VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*> local_a8;
  VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*> local_a0;
  ResultSubstitutionSP resultSubst;
  Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  svBindings;
  anon_class_32_3_b6b1deac_for__func local_70;
  MappingIterator<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:656:16),_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
  local_50;
  
  pLVar1 = (Literal *)CONCAT71(in_register_00000011,retrieveSubstitutions);
  if (in_ECX == 0) {
    local_b0._M_head_impl = (RenamingSubstitution *)0x0;
    resultSubst._obj = (ResultSubstitution *)0x0;
    resultSubst._refCnt = (RefCounter *)0x0;
    pLVar1 = Kernel::Renaming::normalize(pLVar1);
  }
  else {
    std::
    make_unique<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>
              ();
    resultSubst._obj = &(local_b0._M_head_impl)->super_ResultSubstitution;
    resultSubst._refCnt =
         (RefCounter *)Lib::SmartPtr<Indexing::ResultSubstitution>::RefCounter::operator_new(4);
    (resultSubst._refCnt)->_val = 1;
    Kernel::Renaming::normalizeVariables
              ((((Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
                ((long)local_b0._M_head_impl + 8))->_self)._M_t.
               super___uniq_ptr_impl<Kernel::Renaming,_std::default_delete<Kernel::Renaming>_>._M_t.
               super__Tuple_impl<0UL,_Kernel::Renaming_*,_std::default_delete<Kernel::Renaming>_>.
               super__Head_base<0UL,_Kernel::Renaming_*,_false>._M_head_impl,pLVar1);
    pLVar1 = Kernel::Renaming::apply
                       ((((Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *
                          )((long)local_b0._M_head_impl + 8))->_self)._M_t.
                        super___uniq_ptr_impl<Kernel::Renaming,_std::default_delete<Kernel::Renaming>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Kernel::Renaming_*,_std::default_delete<Kernel::Renaming>_>
                        .super__Head_base<0UL,_Kernel::Renaming_*,_false>._M_head_impl,pLVar1);
  }
  Lib::
  Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled(&svBindings);
  createBindings<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::getVariants<Kernel::Literal*>(Kernel::Literal*,bool)::_lambda(auto:1,auto:2)_1_>
            ((SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs> *)query,pLVar1,false,
             &svBindings);
  pLVar2 = findLeaf((SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs> *)query,
                    (BindingMap *)
                    svBindings._self._M_t.
                    super___uniq_ptr_impl<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_std::default_delete<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>_*,_std::default_delete<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>_>_>
                    .
                    super__Head_base<0UL,_Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>_*,_false>
                    ._M_head_impl);
  if (pLVar2 == (Leaf *)0x0) {
    Lib::
    VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
    ::getEmpty();
  }
  else {
    (*(pLVar2->super_Node)._vptr_Node[8])(&local_a8,pLVar2);
    Lib::iterTraits<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs*>>
              ((Lib *)&local_a0,&local_a8);
    local_70.retrieveSubstitutions = SUB41(in_ECX,0);
    local_70.renaming._M_t.
    super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
    ._M_t.
    super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
    .
    super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>,_true,_true>
          )(__uniq_ptr_data<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>,_true,_true>
            )local_b0._M_head_impl;
    local_b0._M_head_impl = (RenamingSubstitution *)0x0;
    local_70.resultSubst._obj = resultSubst._obj;
    local_70.resultSubst._refCnt = resultSubst._refCnt;
    if (resultSubst._refCnt != (RefCounter *)0x0 && resultSubst._obj != (ResultSubstitution *)0x0) {
      (resultSubst._refCnt)->_val = (resultSubst._refCnt)->_val + 1;
    }
    Lib::IterTraits<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs*>>::
    map<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::getVariants<Kernel::Literal*>(Kernel::Literal*,bool)::_lambda(Inferences::ALASCA::BinaryResolutionConf::Rhs*)_1_>
              ((IterTraits<Lib::MappingIterator<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:656:16),_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>
                *)&local_50,&local_a0,&local_70);
    Lib::
    pvi<Lib::IterTraits<Lib::MappingIterator<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs*>,Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::getVariants<Kernel::Literal*>(Kernel::Literal*,bool)::_lambda(Inferences::ALASCA::BinaryResolutionConf::Rhs*)_1_,Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Rhs>>>>
              ((Lib *)this,
               (IterTraits<Lib::MappingIterator<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:656:16),_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>
                *)&local_50);
    Lib::
    MappingIterator<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/SubstitutionTree.hpp:656:16),_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
    ::~MappingIterator(&local_50);
    getVariants<Kernel::Literal*>(Kernel::Literal*,bool)::
    {lambda(Inferences::ALASCA::BinaryResolutionConf::Rhs*)#1}::~VirtualIterator
              ((_lambda_Inferences__ALASCA__BinaryResolutionConf__Rhs___1_ *)&local_70);
    Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*>::~VirtualIterator
              (&local_a0);
    Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*>::~VirtualIterator
              (&local_a8);
  }
  Lib::
  Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(&svBindings);
  Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr(&resultSubst);
  if ((_Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
       )local_b0._M_head_impl != (RenamingSubstitution *)0x0) {
    (*(*(_func_int ***)local_b0._M_head_impl)[1])();
  }
  return (VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
          )(IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
            *)this;
}

Assistant:

VirtualIterator<QueryRes<ResultSubstitutionSP, LeafData>> getVariants(Query query, bool retrieveSubstitutions)
    {
      auto renaming = retrieveSubstitutions ? std::make_unique<RenamingSubstitution>() : std::unique_ptr<RenamingSubstitution>(nullptr);
      ResultSubstitutionSP resultSubst = retrieveSubstitutions ? ResultSubstitutionSP(&*renaming) : ResultSubstitutionSP();

      Query normQuery;
      if (retrieveSubstitutions) {
        renaming->_query->normalizeVariables(query);
        normQuery = renaming->_query->apply(query);
      } else {
        normQuery = Renaming::normalize(query);
      }

      Recycled<BindingMap> svBindings;
      createBindings(normQuery, /* reversed */ false,
          [&](auto v, auto t) { {
            svBindings->insert(v, t);
          } });
      Leaf* leaf = findLeaf(*svBindings);
      if(leaf==0) {
        return VirtualIterator<QueryRes<ResultSubstitutionSP, LeafData>>::getEmpty();
      } else {
        return pvi(iterTraits(leaf->allChildren())
          .map([retrieveSubstitutions, renaming = std::move(renaming), resultSubst](LeafData* ld) 
            {
              ResultSubstitutionSP subs;
              if (retrieveSubstitutions) {
                renaming->_result->reset();
                renaming->_result->normalizeVariables(ld->key());
                subs = resultSubst;
              }
              return QueryRes(subs, ld);
            }));
      }
    }